

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetMassTimes(void *arkode_mem,ARKLsMassTimesSetupFn mtsetup,ARKLsMassTimesVecFn mtimes,
                      void *mtimes_data)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  ARKLsMassMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar1 = 0x6e8;
  }
  else if (*(int *)((long)arkode_mem + 0x1e8) == 0) {
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    error_code = -0x30;
    iVar1 = 0x6f1;
  }
  else {
    iVar1 = arkLs_AccessMassMem((ARKodeMem)arkode_mem,"ARKodeSetMassTimes",&arkls_mem);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (mtimes == (ARKLsMassTimesVecFn)0x0) {
      msgfmt = "non-NULL mtimes function must be supplied";
      error_code = -3;
      iVar1 = 0x6fd;
    }
    else if (arkls_mem->LS->ops->setatimes ==
             (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied ATimes routine";
      error_code = -3;
      iVar1 = 0x705;
    }
    else {
      arkls_mem->mtsetup = mtsetup;
      arkls_mem->mtimes = mtimes;
      arkls_mem->mt_data = mtimes_data;
      iVar1 = SUNLinSolSetATimes(arkls_mem->LS,arkode_mem,arkLsMTimes);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetATimes";
      error_code = -0xc;
      iVar1 = 0x714;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetMassTimes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetMassTimes(void* arkode_mem, ARKLsMassTimesSetupFn mtsetup,
                       ARKLsMassTimesVecFn mtimes, void* mtimes_data)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* issue error if mtimes function is unusable */
  if (mtimes == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "non-NULL mtimes function must be supplied");
    return (ARKLS_ILL_INPUT);
  }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (arkls_mem->LS->ops->setatimes == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (ARKLS_ILL_INPUT);
  }

  /* store pointers for user-supplied routines and data structure
     in ARKLs interface */
  arkls_mem->mtsetup = mtsetup;
  arkls_mem->mtimes  = mtimes;
  arkls_mem->mt_data = mtimes_data;

  /* notify linear solver to call ARKLs interface routine */
  retval = SUNLinSolSetATimes(arkls_mem->LS, ark_mem, arkLsMTimes);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetATimes");
    return (ARKLS_SUNLS_FAIL);
  }

  return (ARKLS_SUCCESS);
}